

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.c
# Opt level: O0

void abuf_add_template(autobuf *out,abuf_template_storage *storage,_Bool keys)

{
  abuf_template_storage_entry *paVar1;
  char *pcVar2;
  char *local_40;
  char *value;
  size_t last;
  size_t i;
  abuf_template_storage_entry *entry;
  _Bool keys_local;
  abuf_template_storage *storage_local;
  autobuf *out_local;
  
  value = (char *)0x0;
  for (last = 0; last < storage->count; last = last + 1) {
    paVar1 = storage->indices + last;
    if (value < (char *)paVar1->start) {
      abuf_memcpy(out,storage->format + (long)value,paVar1->start - (long)value);
    }
    if (keys) {
      local_40 = paVar1->data->key;
    }
    else {
      local_40 = paVar1->data->value;
    }
    if (local_40 != (char *)0x0) {
      abuf_puts(out,local_40);
    }
    value = (char *)paVar1->end;
  }
  pcVar2 = (char *)strlen(storage->format);
  if (value < pcVar2) {
    abuf_puts(out,storage->format + (long)value);
  }
  return;
}

Assistant:

void
abuf_add_template(struct autobuf *out, struct abuf_template_storage *storage, bool keys) {
  struct abuf_template_storage_entry *entry;
  size_t i, last = 0;
  const char *value;

  for (i = 0; i < storage->count; i++) {
    entry = &storage->indices[i];

    /* copy prefix text */
    if (last < entry->start) {
      abuf_memcpy(out, &storage->format[last], entry->start - last);
    }

    if (keys) {
      value = entry->data->key;
    }
    else {
      value = entry->data->value;
    }
    if (value) {
      abuf_puts(out, value);
    }
    last = entry->end;
  }

  if (last < strlen(storage->format)) {
    abuf_puts(out, &storage->format[last]);
  }
}